

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

size_t wabt::cat_compute_size<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                 (char (*t) [11],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                 char (*args_1) [8],
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                 char (*args_3) [2])

{
  size_type sVar1;
  size_t sVar2;
  string_view local_40;
  char (*local_30) [2];
  char (*args_local_3) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char (*args_local_1) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char (*t_local) [11];
  
  local_30 = args_3;
  args_local_3 = (char (*) [2])args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (char (*) [8])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t;
  string_view::string_view(&local_40,*t);
  sVar1 = string_view::size(&local_40);
  sVar2 = cat_compute_size<std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args_local_1,(char (*) [8])args_local_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args_local_3,local_30);
  return sVar1 + sVar2;
}

Assistant:

size_t cat_compute_size(const T& t, const Ts&... args) {
    return string_view(t).size() + cat_compute_size(args...);
}